

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CZipReader.cpp
# Opt level: O1

IFileArchive * __thiscall
irr::io::CArchiveLoaderZIP::createArchive
          (CArchiveLoaderZIP *this,path *filename,bool ignoreCase,bool ignorePaths)

{
  int *piVar1;
  long lVar2;
  int iVar3;
  long *plVar4;
  undefined4 extraout_var;
  IFileArchive *pIVar5;
  
  plVar4 = (long *)(**(code **)**(undefined8 **)&(this->super_IArchiveLoader).field_0x8)();
  if (plVar4 == (long *)0x0) {
    pIVar5 = (IFileArchive *)0x0;
  }
  else {
    iVar3 = (*(this->super_IArchiveLoader)._vptr_IArchiveLoader[4])
                      (this,plVar4,ignoreCase,ignorePaths);
    pIVar5 = (IFileArchive *)CONCAT44(extraout_var,iVar3);
    lVar2 = *(long *)(*plVar4 + -0x18);
    piVar1 = (int *)((long)plVar4 + lVar2 + 0x10);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      plVar4 = (long *)((long)plVar4 + lVar2);
      (**(code **)(*plVar4 + 8))(plVar4);
    }
  }
  return pIVar5;
}

Assistant:

IFileArchive *CArchiveLoaderZIP::createArchive(const io::path &filename, bool ignoreCase, bool ignorePaths) const
{
	IFileArchive *archive = 0;
	io::IReadFile *file = FileSystem->createAndOpenFile(filename);

	if (file) {
		archive = createArchive(file, ignoreCase, ignorePaths);
		file->drop();
	}

	return archive;
}